

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O0

double __thiscall
GammaHandler::pairProduction
          (GammaHandler *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *sourceInfo,vector<double,_std::allocator<double>_> *xyTry)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  double extraout_XMM0_Qa;
  double pp;
  double co;
  double pe;
  double br;
  double initialEnergy_1;
  int i;
  double shiftedEnergy;
  double initialEnergy;
  double energyScaleFactor;
  vector<double,_std::allocator<double>_> *xyTry_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *sourceInfo_local;
  GammaHandler *this_local;
  
  initialEnergy_1._4_4_ = 0;
  while( true ) {
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(sourceInfo);
    if (sVar5 <= (ulong)(long)initialEnergy_1._4_4_) {
      return 0.0;
    }
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](sourceInfo,(long)initialEnergy_1._4_4_);
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](sourceInfo,(long)initialEnergy_1._4_4_);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,1);
    dVar1 = *pvVar7;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](sourceInfo,(long)initialEnergy_1._4_4_);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,2);
    dVar2 = *pvVar7;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](sourceInfo,(long)initialEnergy_1._4_4_);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,3);
    dVar3 = *pvVar7;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](sourceInfo,(long)initialEnergy_1._4_4_);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,4);
    dVar4 = *pvVar7;
    pvVar8 = xyTry;
    std::vector<double,_std::allocator<double>_>::operator[](xyTry,0);
    std::abs((int)pvVar8);
    if (extraout_XMM0_Qa < brThresh) break;
    initialEnergy_1._4_4_ = initialEnergy_1._4_4_ + 1;
  }
  return yMax * dVar1 * (dVar4 / (dVar2 + dVar3 + dVar4));
}

Assistant:

double GammaHandler::pairProduction(const vector<vector<double>>& sourceInfo,
                                    const vector<double>& xyTry) {
  double energyScaleFactor =
      ElectronRestMassEnergy;  // mc^2 for electron mass in keV
  double initialEnergy, shiftedEnergy;
  // loop over allowed gamma energies
  for (int i = 0; i < sourceInfo.size(); i++) {
    double initialEnergy = sourceInfo[i][0];
    double br = sourceInfo[i][1];
    double pe = sourceInfo[i][2];
    double co = sourceInfo[i][3];
    double pp = sourceInfo[i][4];
    shiftedEnergy = (0.5) * (initialEnergy -
                             2 * energyScaleFactor);  // Pair production energy
    if (abs(xyTry[0] - shiftedEnergy) < brThresh) {
      return yMax * br * (pp / (pe + co + pp));
    }
  }
  return 0.0;
}